

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardware.cpp
# Opt level: O2

void Cmd_vid_listmodes(FCommandLine *argv,APlayerPawn *who,int key)

{
  IVideo *pIVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  bool bVar7;
  bool letterbox;
  int height;
  int width;
  
  if (Video != (IVideo *)0x0) {
    for (uVar5 = 1; pIVar1 = Video, uVar5 != 0x21; uVar5 = uVar5 + 1) {
      uVar2 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x21])();
      (*pIVar1->_vptr_IVideo[5])(pIVar1,(ulong)uVar5,(ulong)(uVar2 & 0xff));
      while (iVar3 = (*Video->_vptr_IVideo[6])(Video,&width,&height,&letterbox), (char)iVar3 != '\0'
            ) {
        bVar7 = false;
        if ((width == DisplayWidth) && (height == DisplayHeight)) {
          bVar7 = uVar5 == DisplayBits;
        }
        uVar2 = CheckRatio(width,height,(int *)0x0);
        pcVar4 = "\x1cF";
        if ((uVar2 & 3) == 0) {
          pcVar4 = "";
        }
        pcVar6 = "";
        if ((letterbox & 1U) != 0) {
          pcVar6 = "\x1cE LB";
        }
        iVar3 = 2;
        if (bVar7) {
          iVar3 = 200;
          pcVar4 = "";
        }
        if (bVar7) {
          pcVar6 = "";
        }
        Printf(iVar3,"%s%4d x%5d x%3d%s%s\n",pcVar4,(ulong)(uint)width,(ulong)(uint)height,
               (ulong)uVar5,
               _ZZ17Cmd_vid_listmodesR12FCommandLineP11APlayerPawniE6ratios_rel +
               *(int *)(_ZZ17Cmd_vid_listmodesR12FCommandLineP11APlayerPawniE6ratios_rel +
                       (long)(int)uVar2 * 4),pcVar6);
      }
    }
  }
  return;
}

Assistant:

CCMD (vid_listmodes)
{
	static const char *ratios[7] = { "", " - 16:9", " - 16:10", "", " - 5:4", "", " - 21:9" };
	int width, height, bits;
	bool letterbox;

	if (Video == NULL)
	{
		return;
	}
	for (bits = 1; bits <= 32; bits++)
	{
		Video->StartModeIterator (bits, screen->IsFullscreen());
		while (Video->NextMode (&width, &height, &letterbox))
		{
			bool thisMode = (width == DisplayWidth && height == DisplayHeight && bits == DisplayBits);
			int ratio = CheckRatio (width, height);
			Printf (thisMode ? PRINT_BOLD : PRINT_HIGH,
				"%s%4d x%5d x%3d%s%s\n",
				thisMode || !IsRatioWidescreen(ratio) ? "" : TEXTCOLOR_GOLD,
				width, height, bits,
				ratios[ratio],
				thisMode || !letterbox ? "" : TEXTCOLOR_BROWN " LB"
				);
		}
	}
}